

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml_print.hpp
# Opt level: O1

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 rapidxml::internal::print_pi_node<std::back_insert_iterator<std::__cxx11::string>,char>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,xml_node<char> *node,int flags,int indent)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (node->m_type == node_pi) {
    cVar1 = (char)out.container;
    if (0 < indent && (flags & 1U) == 0) {
      do {
        std::__cxx11::string::push_back(cVar1);
        indent = indent + -1;
      } while (indent != 0);
    }
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::push_back(cVar1);
    if ((node->super_xml_base<char>).m_name == (char *)0x0) {
      sVar3 = 0;
    }
    else {
      sVar3 = (node->super_xml_base<char>).m_name_size;
    }
    if (sVar3 != 0) {
      sVar2 = 0;
      do {
        std::__cxx11::string::push_back(cVar1);
        sVar2 = sVar2 + 1;
      } while (sVar3 != sVar2);
    }
    std::__cxx11::string::push_back(cVar1);
    if ((node->super_xml_base<char>).m_value == (char *)0x0) {
      sVar3 = 0;
    }
    else {
      sVar3 = (node->super_xml_base<char>).m_value_size;
    }
    if (sVar3 != 0) {
      sVar2 = 0;
      do {
        std::__cxx11::string::push_back(cVar1);
        sVar2 = sVar2 + 1;
      } while (sVar3 != sVar2);
    }
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::push_back(cVar1);
    return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )out.container;
  }
  __assert_fail("node->type() == node_pi",
                "/workspace/llm4binary/github/license_c_cmakelists/avplayer[P]serialization2/examples/../include/serialization/detail/rapidxml/rapidxml_print.hpp"
                ,0x174,
                "OutIt rapidxml::internal::print_pi_node(OutIt, const xml_node<Ch> *, int, int) [OutIt = std::back_insert_iterator<std::basic_string<char>>, Ch = char]"
               );
}

Assistant:

inline OutIt print_pi_node(OutIt out, const xml_node<Ch> *node, int flags, int indent)
        {
            assert(node->type() == node_pi);
            if (!(flags & print_no_indenting))
                out = fill_chars(out, indent, Ch('\t'));
            *out = Ch('<'), ++out;
            *out = Ch('?'), ++out;
            out = copy_chars(node->name(), node->name() + node->name_size(), out);
            *out = Ch(' '), ++out;
            out = copy_chars(node->value(), node->value() + node->value_size(), out);
            *out = Ch('?'), ++out;
            *out = Ch('>'), ++out;
            return out;
        }